

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O3

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
jessilib::
split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,jessilib *this,char *begin,char *end,char *in_delim_begin,
          char *in_delim_end)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t __len;
  size_t __n;
  
  __n = (long)in_delim_begin - (long)end;
  if (__n == 1) {
    if (this < begin) {
      sVar3 = 0;
      do {
        if (this[sVar3] == (jessilib)*end) {
          (__return_storage_ptr__->first)._M_len = sVar3;
          (__return_storage_ptr__->first)._M_str = (char *)this;
          (__return_storage_ptr__->second)._M_len = (size_t)(begin + (~(ulong)this - sVar3));
          (__return_storage_ptr__->second)._M_str = (char *)(this + sVar3 + 1);
          return __return_storage_ptr__;
        }
        lVar1 = sVar3 + 1;
        sVar3 = sVar3 + 1;
      } while (this + lVar1 != (jessilib *)begin);
      (__return_storage_ptr__->first)._M_len = (long)begin - (long)this;
LAB_00133d39:
      (__return_storage_ptr__->first)._M_str = (char *)this;
      (__return_storage_ptr__->second)._M_len = 0;
      (__return_storage_ptr__->second)._M_str = (char *)0x0;
      return __return_storage_ptr__;
    }
  }
  else if (this < begin) {
    sVar3 = (long)begin - (long)this;
    if (end < in_delim_begin && (long)__n <= (long)sVar3) {
      if (this < (jessilib *)(begin + (1 - __n))) {
        sVar4 = 0;
        do {
          iVar2 = bcmp(end,this + sVar4,__n);
          if (iVar2 == 0) {
            (__return_storage_ptr__->first)._M_len = sVar4;
            (__return_storage_ptr__->first)._M_str = (char *)this;
            (__return_storage_ptr__->second)._M_len =
                 (size_t)(end + (long)begin + ((-(long)in_delim_begin - (long)this) - sVar4));
            (__return_storage_ptr__->second)._M_str = (char *)(this + sVar4 + __n);
            return __return_storage_ptr__;
          }
          lVar1 = sVar4 + 1;
          sVar4 = sVar4 + 1;
        } while (this + lVar1 < (jessilib *)(begin + (1 - __n)));
      }
      (__return_storage_ptr__->first)._M_len = sVar3;
      (__return_storage_ptr__->first)._M_str = (char *)this;
      (__return_storage_ptr__->second)._M_len = 0;
      (__return_storage_ptr__->second)._M_str = (char *)0x0;
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->first)._M_len = sVar3;
    goto LAB_00133d39;
  }
  (__return_storage_ptr__->second)._M_len = 0;
  (__return_storage_ptr__->second)._M_str = (char *)0x0;
  (__return_storage_ptr__->first)._M_len = 0;
  (__return_storage_ptr__->first)._M_str = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, DelimItrT in_delim_begin, DelimEndT in_delim_end) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using ElementT = std::remove_cvref_t<decltype(*begin)>;
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	auto delim_length = std::distance(in_delim_begin, in_delim_end);
	if (delim_length == 1) {
		return split_once<OptionalMemberT...>(begin, end, *in_delim_begin);
	}

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	if (in_delim_begin >= in_delim_end
		|| (end - begin) < delim_length) {
		// Absent or impossible to match delimiter, therefore no match, therefore return input as single token
		result.first = make_split_member<MemberT>(begin, end);
		return result;
	}

	auto itr_end = end - (delim_length - 1);
	for (auto itr = begin; itr < itr_end; ++itr) {
		if (std::equal(in_delim_begin, in_delim_end, itr)) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + delim_length, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}